

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tobinary.cpp
# Opt level: O0

void checkOptions(Options *opts)

{
  Options *pOVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  allocator local_219;
  string local_218;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Options *local_10;
  Options *opts_local;
  
  local_10 = opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"author=b",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"Author of the program",&local_69);
  smf::Options::define(opts,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"version=b",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"Version of the program",&local_b9);
  smf::Options::define(pOVar1,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"example=b",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"Example useage of the program",&local_109);
  smf::Options::define(pOVar1,&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"h|help=b",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"List of options for the program",&local_159);
  smf::Options::define(pOVar1,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  smf::Options::process(local_10,1,0);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"author",&local_181);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  pOVar1 = local_10;
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    poVar4 = std::operator<<(poVar4,"craig@ccrma.stanford.edu, February 2015");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"version",&local_1a9);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  pOVar1 = local_10;
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"tobinary, version 1.0 (18 Feb 2015)\n");
    poVar4 = std::operator<<(poVar4,"compiled: ");
    poVar4 = std::operator<<(poVar4,"Apr 26 2025");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"help",&local_1d1);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  pOVar1 = local_10;
  if (bVar2) {
    smf::Options::getCommand_abi_cxx11_(&local_1f8,local_10);
    usage(&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"example",&local_219);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  if (!bVar2) {
    iVar3 = smf::Options::getArgCount(local_10);
    if (2 < iVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Too many filenames given.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    iVar3 = smf::Options::getArgCount(local_10);
    if (iVar3 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Too few filenames given.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    return;
  }
  example();
  exit(0);
}

Assistant:

void checkOptions(Options& opts) {
	opts.define("author=b",   "Author of the program");
	opts.define("version=b",  "Version of the program");
	opts.define("example=b",  "Example useage of the program");
	opts.define("h|help=b",   "List of options for the program");
	opts.process();

	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
		     << "craig@ccrma.stanford.edu, February 2015" << endl;
		exit(0);
	} else if (opts.getBoolean("version")) {
		cout << "tobinary, version 1.0 (18 Feb 2015)\n"
		     << "compiled: " << __DATE__ << endl;
		exit(0);
	} else if (opts.getBoolean("help")) {
		usage(opts.getCommand());
		exit(0);
	} else if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	if (opts.getArgCount() > 2) {
		cerr << "Error: Too many filenames given." << endl;
		exit(1);
	}
	if (opts.getArgCount() == 0) {
		cerr << "Error: Too few filenames given." << endl;
		exit(1);
	}

}